

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O0

opj_thread_pool_t * opj_thread_pool_create(int num_threads)

{
  OPJ_BOOL OVar1;
  opj_tls_t *poVar2;
  opj_mutex_t *poVar3;
  opj_thread_pool_t *local_20;
  opj_thread_pool_t *tp;
  opj_thread_pool_t *poStack_10;
  int num_threads_local;
  
  local_20 = (opj_thread_pool_t *)opj_calloc(1,0x58);
  if (local_20 == (opj_thread_pool_t *)0x0) {
    poStack_10 = (opj_thread_pool_t *)0x0;
  }
  else {
    local_20->state = OPJWTS_OK;
    if (num_threads < 1) {
      poVar2 = opj_tls_new();
      local_20->tls = poVar2;
      if (local_20->tls == (opj_tls_t *)0x0) {
        opj_free(local_20);
        local_20 = (opj_thread_pool_t *)0x0;
      }
      poStack_10 = local_20;
    }
    else {
      poVar3 = opj_mutex_create();
      local_20->mutex = poVar3;
      if (local_20->mutex == (opj_mutex_t *)0x0) {
        opj_free(local_20);
        poStack_10 = (opj_thread_pool_t *)0x0;
      }
      else {
        OVar1 = opj_thread_pool_setup(local_20,num_threads);
        poStack_10 = local_20;
        if (OVar1 == 0) {
          opj_thread_pool_destroy(local_20);
          poStack_10 = (opj_thread_pool_t *)0x0;
        }
      }
    }
  }
  return poStack_10;
}

Assistant:

opj_thread_pool_t* opj_thread_pool_create(int num_threads)
{
    opj_thread_pool_t* tp;

    tp = (opj_thread_pool_t*) opj_calloc(1, sizeof(opj_thread_pool_t));
    if (!tp) {
        return NULL;
    }
    tp->state = OPJWTS_OK;

    if (num_threads <= 0) {
        tp->tls = opj_tls_new();
        if (!tp->tls) {
            opj_free(tp);
            tp = NULL;
        }
        return tp;
    }

    tp->mutex = opj_mutex_create();
    if (!tp->mutex) {
        opj_free(tp);
        return NULL;
    }
    if (!opj_thread_pool_setup(tp, num_threads)) {
        opj_thread_pool_destroy(tp);
        return NULL;
    }
    return tp;
}